

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

bool __thiscall HMatrix::setup_ok(HMatrix *this,int *nonbasicFlag_)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *__format;
  ulong uVar8;
  
  puts("Checking row-wise matrix");
  uVar1 = this->numRow;
  piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  do {
    uVar6 = uVar4;
    if (uVar6 == uVar8) {
LAB_0012b91f:
      return (long)(int)uVar1 <= (long)uVar6;
    }
    uVar5 = (ulong)(this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
    for (uVar4 = (ulong)piVar2[uVar6]; (long)uVar4 < (long)uVar5; uVar4 = uVar4 + 1) {
      lVar7 = (long)piVar3[uVar4];
      if (nonbasicFlag_[lVar7] == 0) {
        __format = "Row-wise matrix error: col %d, (el = %d for row %d) is basic\n";
        uVar5 = uVar4 & 0xffffffff;
        goto LAB_0012b916;
      }
    }
    for (; uVar4 = uVar6 + 1, (long)uVar5 < (long)piVar2[uVar6 + 1]; uVar5 = uVar5 + 1) {
      lVar7 = (long)piVar3[uVar5];
      if (nonbasicFlag_[lVar7] != 0) {
        __format = "Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n";
LAB_0012b916:
        printf(__format,lVar7,uVar5,uVar6 & 0xffffffff);
        goto LAB_0012b91f;
      }
    }
  } while( true );
}

Assistant:

bool HMatrix::setup_ok(const int *nonbasicFlag_) {
  printf("Checking row-wise matrix\n");
  for (int row = 0; row < numRow; row++) {
    for (int el = ARstart[row]; el < AR_Nend[row]; el++) {
      int col = ARindex[el];
      if (!nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is basic\n", col, el, row);
	return false;
      }
    }
    for (int el = AR_Nend[row]; el < ARstart[row+1]; el++) {
      int col = ARindex[el];
      if (nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n", col, el, row);
	return false;
      }
    }
  }
  return true;
}